

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigFeed.c
# Opt level: O1

int Fraig_FeedBackCompress(Fraig_Man_t *p)

{
  Fraig_HashTable_t *pFVar1;
  Msat_IntVec_t *p_00;
  Fraig_Node_t **ppFVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Fraig_NodeVec_t *pFVar7;
  Fraig_NodeVec_t *pFVar8;
  Fraig_Node_t *pFVar9;
  void *__ptr;
  int *piVar10;
  Fraig_MemFixed_t *p_01;
  uint *puVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  Fraig_Node_t *pFVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  uint *puVar24;
  long lVar25;
  uint uVar26;
  long lVar27;
  ulong uVar15;
  
  iVar6 = p->nBTLimit;
  if ((iVar6 == -1) && (Fraig_FeedBackCheckTable(p), p->fDoSparse != 0)) {
    Fraig_FeedBackCheckTableF0(p);
  }
  pFVar1 = p->pTableF;
  p_00 = p->vPatsReal;
  pFVar7 = Fraig_NodeVecAlloc(100);
  if (0 < pFVar1->nBins) {
    lVar14 = 0;
    do {
      for (pFVar20 = pFVar1->pBins[lVar14]; pFVar20 != (Fraig_Node_t *)0x0;
          pFVar20 = pFVar20->pNextF) {
        p->vCones->nSize = 0;
        pFVar9 = pFVar20;
        do {
          Fraig_NodeVecPush(p->vCones,pFVar9);
          pFVar9 = pFVar9->pNextD;
        } while (pFVar9 != (Fraig_Node_t *)0x0);
        if (p->vCones->nSize - 2U < 0x13) {
          lVar27 = 1;
          lVar16 = 0;
          do {
            lVar25 = lVar16 + 1;
            pFVar8 = p->vCones;
            lVar23 = lVar27;
            if (lVar25 < pFVar8->nSize) {
              do {
                iVar4 = Fraig_CompareSimInfoUnderMask
                                  (pFVar8->pArray[lVar16],pFVar8->pArray[lVar23],p->iWordStart,0,
                                   p->pSimsReal);
                if (iVar4 != 0) {
                  pFVar9 = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmSims);
                  if (0 < p->iWordStart) {
                    ppFVar2 = p->vCones->pArray;
                    puVar11 = ppFVar2[lVar16]->puSimD;
                    puVar24 = ppFVar2[lVar23]->puSimD;
                    puVar3 = p->pSimsReal;
                    lVar19 = 0;
                    do {
                      (&pFVar9->Num)[lVar19] = ~puVar3[lVar19] & (puVar24[lVar19] ^ puVar11[lVar19])
                      ;
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < p->iWordStart);
                  }
                  Fraig_NodeVecPush(pFVar7,pFVar9);
                }
                lVar23 = lVar23 + 1;
                pFVar8 = p->vCones;
              } while ((int)lVar23 < pFVar8->nSize);
            }
            lVar27 = lVar27 + 1;
            lVar16 = lVar25;
          } while (lVar25 < p->vCones->nSize);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pFVar1->nBins);
  }
  if (p->fDoSparse != 0) {
    pFVar1 = p->pTableF0;
    iVar4 = pFVar1->nBins;
    if (0 < (long)iVar4) {
      ppFVar2 = pFVar1->pBins;
      lVar14 = 0;
      do {
        pFVar20 = ppFVar2[lVar14];
        if (pFVar20 != (Fraig_Node_t *)0x0) {
          uVar5 = p->iWordStart;
          do {
            pFVar20->uHashD = 0;
            if (0 < (int)uVar5) {
              puVar11 = p->pSimsReal;
              uVar22 = 0;
              uVar18 = 0;
              do {
                uVar18 = uVar18 ^ (puVar11[uVar22] & pFVar20->puSimD[uVar22]) *
                                  s_FraigPrimes[uVar22];
                pFVar20->uHashD = uVar18;
                uVar22 = uVar22 + 1;
              } while (uVar5 != uVar22);
            }
            pFVar20 = pFVar20->pNextF;
          } while (pFVar20 != (Fraig_Node_t *)0x0);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != iVar4);
    }
    Fraig_TableRehashF0(p,1);
    if (0 < pFVar1->nBins) {
      lVar14 = 0;
      do {
        for (pFVar20 = pFVar1->pBins[lVar14]; pFVar20 != (Fraig_Node_t *)0x0;
            pFVar20 = pFVar20->pNextF) {
          p->vCones->nSize = 0;
          pFVar9 = pFVar20;
          do {
            Fraig_NodeVecPush(p->vCones,pFVar9);
            pFVar9 = pFVar9->pNextD;
          } while (pFVar9 != (Fraig_Node_t *)0x0);
          if (1 < p->vCones->nSize) {
            lVar27 = 1;
            lVar16 = 0;
            do {
              lVar25 = lVar16 + 1;
              lVar23 = lVar27;
              if (lVar25 < p->vCones->nSize) {
                do {
                  pFVar9 = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmSims);
                  if (0 < p->iWordStart) {
                    ppFVar2 = p->vCones->pArray;
                    puVar11 = ppFVar2[lVar16]->puSimD;
                    puVar24 = ppFVar2[lVar23]->puSimD;
                    puVar3 = p->pSimsReal;
                    lVar19 = 0;
                    do {
                      (&pFVar9->Num)[lVar19] = ~puVar3[lVar19] & (puVar24[lVar19] ^ puVar11[lVar19])
                      ;
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < p->iWordStart);
                  }
                  Fraig_NodeVecPush(pFVar7,pFVar9);
                  lVar23 = lVar23 + 1;
                } while ((int)lVar23 < p->vCones->nSize);
              }
              lVar27 = lVar27 + 1;
              lVar16 = lVar25;
            } while (lVar25 < p->vCones->nSize);
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < pFVar1->nBins);
    }
  }
  iVar4 = pFVar7->nSize;
  __ptr = malloc((long)iVar4 * 4);
  if (0 < (long)iVar4) {
    lVar14 = 0;
    do {
      iVar4 = Fraig_BitStringCountOnes((uint *)pFVar7->pArray[lVar14],p->iWordStart);
      *(int *)((long)__ptr + lVar14 * 4) = iVar4;
      lVar14 = lVar14 + 1;
    } while (lVar14 < pFVar7->nSize);
  }
  Msat_IntVecReadSize(p_00);
  do {
    iVar4 = pFVar7->nSize;
    uVar22 = (ulong)iVar4;
    uVar15 = 0xffffffff;
    iVar12 = -1;
    if (0 < (long)uVar22) {
      iVar21 = 1000000;
      uVar17 = 0;
      do {
        iVar12 = *(int *)((long)__ptr + uVar17 * 4);
        if (iVar12 != 0) {
          if (iVar12 == 1) {
            iVar12 = (int)uVar17;
            break;
          }
          if (iVar12 < iVar21) {
            uVar15 = uVar17 & 0xffffffff;
          }
          if (iVar12 <= iVar21) {
            iVar21 = iVar12;
          }
        }
        iVar12 = (int)uVar15;
        uVar17 = uVar17 + 1;
      } while (uVar22 != uVar17);
    }
    if (iVar12 == -1) {
      if (0 < iVar4) {
        lVar14 = 0;
        do {
          Fraig_MemFixedEntryRecycle(p->mmSims,(char *)pFVar7->pArray[lVar14]);
          lVar14 = lVar14 + 1;
        } while (lVar14 < pFVar7->nSize);
      }
      Fraig_NodeVecFree(pFVar7);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      uVar5 = Msat_IntVecReadSize(p->vPatsReal);
      piVar10 = Msat_IntVecReadArray(p->vPatsReal);
      uVar18 = p->iPatsPerm + uVar5;
      p->iWordStart = (((int)uVar18 >> 5) + 1) - (uint)((uVar18 & 0x1f) == 0);
      pFVar7 = p->vInputs;
      if (0 < pFVar7->nSize) {
        ppFVar2 = pFVar7->pArray;
        lVar14 = 0;
        do {
          pFVar20 = ppFVar2[lVar14];
          puVar11 = pFVar20->puSimD;
          lVar16 = (long)p->iWordPerm;
          if (p->iWordPerm < p->iWordStart) {
            puVar24 = p->pSimsTemp;
            do {
              puVar24[lVar16] = 0;
              lVar16 = lVar16 + 1;
            } while (lVar16 < p->iWordStart);
          }
          if (0 < (int)uVar5) {
            uVar22 = 0;
            do {
              if ((puVar11[piVar10[uVar22] >> 5] >> (piVar10[uVar22] & 0x1fU) & 1) != 0) {
                lVar16 = (uint)p->iPatsPerm + uVar22;
                iVar4 = (int)lVar16;
                puVar24 = puVar11;
                if (p->iWordPerm * 0x20 <= iVar4) {
                  puVar24 = p->pSimsTemp;
                }
                puVar24[iVar4 >> 5] = puVar24[iVar4 >> 5] | 1 << ((byte)lVar16 & 0x1f);
              }
              uVar22 = uVar22 + 1;
            } while (uVar5 != uVar22);
          }
          lVar16 = (long)p->iWordPerm;
          uVar18 = p->iWordStart;
          if (p->iWordPerm < (int)uVar18) {
            puVar24 = p->pSimsTemp;
            do {
              puVar11[lVar16] = puVar24[lVar16];
              lVar16 = lVar16 + 1;
              uVar18 = p->iWordStart;
            } while (lVar16 < (int)uVar18);
          }
          if ((int)uVar18 < 1) {
            uVar26 = 0;
          }
          else {
            uVar22 = 0;
            uVar26 = 0;
            do {
              uVar26 = uVar26 ^ s_FraigPrimes[uVar22] * puVar11[uVar22];
              uVar22 = uVar22 + 1;
            } while (uVar18 != uVar22);
          }
          pFVar20->uHashD = uVar26;
          lVar14 = lVar14 + 1;
        } while (lVar14 < pFVar7->nSize);
      }
      p->iWordPerm = p->iWordStart;
      uVar5 = p->iPatsPerm + uVar5;
      p->iPatsPerm = uVar5;
      if (p->iWordStart != (((int)uVar5 >> 5) + 1) - (uint)((uVar5 & 0x1f) == 0)) {
        __assert_fail("p->iWordPerm == FRAIG_NUM_WORDS( p->iPatsPerm )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                      ,0x14e,"int Fraig_FeedBackCompress(Fraig_Man_t *)");
      }
      pFVar7 = p->vNodes;
      if (1 < pFVar7->nSize) {
        lVar14 = 1;
        do {
          iVar4 = Fraig_NodeIsAnd(pFVar7->pArray[lVar14]);
          if (iVar4 != 0) {
            pFVar20 = p->vNodes->pArray[lVar14];
            pFVar20->uHashD = 0;
            Fraig_NodeSimulate(pFVar20,0,p->iWordPerm,0);
          }
          lVar14 = lVar14 + 1;
          pFVar7 = p->vNodes;
        } while (lVar14 < pFVar7->nSize);
      }
      if (iVar6 == -1) {
        Fraig_FeedBackCheckTable(p);
      }
      if ((p->fDoSparse != 0) && (Fraig_TableRehashF0(p,0), iVar6 == -1)) {
        Fraig_FeedBackCheckTableF0(p);
      }
      if (p->nWordsDyna < p->iWordPerm + 5) {
        iVar6 = p->nWordsDyna * 2;
        p->nWordsDyna = iVar6;
        p_01 = Fraig_MemFixedStart((iVar6 + p->nWordsRand) * 4);
        pFVar20 = p->pConst1;
        puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        pFVar20->puSimR = puVar11;
        iVar6 = p->nWordsRand;
        pFVar20->puSimD = puVar11 + iVar6;
        memset(puVar11,0,(long)iVar6 << 2);
        memset(pFVar20->puSimD,0,(long)p->nWordsDyna << 2);
        pFVar7 = p->vInputs;
        if (0 < pFVar7->nSize) {
          lVar14 = 0;
          do {
            pFVar20 = pFVar7->pArray[lVar14];
            puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
            memmove(puVar11,pFVar20->puSimR,((long)p->iWordStart + (long)p->nWordsRand) * 4);
            pFVar20->puSimR = puVar11;
            pFVar20->puSimD = puVar11 + p->nWordsRand;
            lVar14 = lVar14 + 1;
            pFVar7 = p->vInputs;
          } while (lVar14 < pFVar7->nSize);
        }
        Fraig_MemFixedStop(p->mmSims,0);
        p->mmSims = p_01;
        pFVar7 = p->vNodes;
        if (1 < pFVar7->nSize) {
          lVar14 = 1;
          do {
            pFVar20 = pFVar7->pArray[lVar14];
            iVar6 = Fraig_NodeIsAnd(pFVar20);
            if (iVar6 != 0) {
              puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
              pFVar20->puSimR = puVar11;
              iVar6 = p->nWordsRand;
              pFVar20->puSimD = puVar11 + iVar6;
              uVar5 = pFVar20->uHashR;
              pFVar20->uHashR = 0;
              Fraig_NodeSimulate(pFVar20,0,iVar6,1);
              if (uVar5 != pFVar20->uHashR) {
                __assert_fail("uSignOld == pNode->uHashR",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                              ,0x2f8,"void Fraig_ReallocateSimulationInfo(Fraig_Man_t *)");
              }
              uVar5 = pFVar20->uHashD;
              pFVar20->uHashD = 0;
              Fraig_NodeSimulate(pFVar20,0,p->iWordStart,0);
              if (uVar5 != pFVar20->uHashD) {
                __assert_fail("uSignOld == pNode->uHashD",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigFeed.c"
                              ,0x2fd,"void Fraig_ReallocateSimulationInfo(Fraig_Man_t *)");
              }
            }
            lVar14 = lVar14 + 1;
            pFVar7 = p->vNodes;
          } while (lVar14 < pFVar7->nSize);
        }
        puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        p->pSimsReal = puVar11;
        memset(puVar11,0,(long)p->nWordsDyna << 2);
        puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        p->pSimsTemp = puVar11;
        puVar11 = (uint *)Fraig_MemFixedEntryFetch(p_01);
        p->pSimsDiff = puVar11;
      }
      Msat_IntVecClear(p->vPatsReal);
      memset(p->pSimsReal,0,(long)p->nWordsDyna << 2);
      iVar6 = p->iWordPerm;
      if (0 < iVar6) {
        puVar11 = p->pSimsReal;
        lVar14 = 0;
        do {
          puVar11[lVar14] = 0xffffffff;
          lVar14 = lVar14 + 1;
          iVar6 = p->iWordPerm;
        } while (lVar14 < iVar6);
      }
      iVar4 = p->iPatsPerm % 0x20;
      if (0 < iVar4) {
        p->pSimsReal[(long)iVar6 + -1] = 0xffffffff >> (-(char)iVar4 & 0x1fU);
      }
      return p->iWordStart;
    }
    ppFVar2 = pFVar7->pArray;
    iVar21 = -1;
    if (0 < (long)p->iWordStart) {
      iVar13 = 0;
      lVar14 = 0;
      do {
        uVar5 = (&ppFVar2[iVar12]->Num)[lVar14];
        if (uVar5 != 0) {
          uVar18 = 0;
          do {
            if ((uVar5 >> (uVar18 & 0x1f) & 1) != 0) {
              iVar21 = uVar18 - iVar13;
              goto LAB_008fe94f;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != 0x20);
        }
        lVar14 = lVar14 + 1;
        iVar13 = iVar13 + -0x20;
      } while (lVar14 != p->iWordStart);
    }
LAB_008fe94f:
    if (0 < iVar4) {
      uVar15 = 0;
      do {
        if (((&ppFVar2[uVar15]->Num)[iVar21 >> 5] & 1 << ((byte)iVar21 & 0x1f)) != 0) {
          *(undefined4 *)((long)__ptr + uVar15 * 4) = 0;
        }
        uVar15 = uVar15 + 1;
      } while (uVar22 != uVar15);
    }
    Msat_IntVecPush(p_00,iVar21);
  } while( true );
}

Assistant:

int Fraig_FeedBackCompress( Fraig_Man_t * p )
{
    unsigned * pSims;
    unsigned uHash;
    int i, w, t, nPats, * pPats;
    int fPerformChecks = (p->nBTLimit == -1);

    // solve the covering problem
    if ( fPerformChecks )
    {
        Fraig_FeedBackCheckTable( p );
        if ( p->fDoSparse ) 
            Fraig_FeedBackCheckTableF0( p );
    }

    // solve the covering problem
    Fraig_FeedBackCovering( p, p->vPatsReal );


    // get the number of additional patterns
    nPats = Msat_IntVecReadSize( p->vPatsReal );
    pPats = Msat_IntVecReadArray( p->vPatsReal );
    // get the new starting word
    p->iWordStart = FRAIG_NUM_WORDS( p->iPatsPerm + nPats );

    // set the simulation info for the PIs
    for ( i = 0; i < p->vInputs->nSize; i++ )
    {
        // get hold of the simulation info for this PI
        pSims = p->vInputs->pArray[i]->puSimD;
        // clean the storage for the new patterns
        for ( w = p->iWordPerm; w < p->iWordStart; w++ )
            p->pSimsTemp[w] = 0;
        // set the patterns
        for ( t = 0; t < nPats; t++ )
            if ( Fraig_BitStringHasBit( pSims, pPats[t] ) )
            {
                // check if this pattern falls into temporary storage
                if ( p->iPatsPerm + t < p->iWordPerm * 32 )
                    Fraig_BitStringSetBit( pSims, p->iPatsPerm + t );
                else
                    Fraig_BitStringSetBit( p->pSimsTemp, p->iPatsPerm + t );
            }
        // copy the pattern 
        for ( w = p->iWordPerm; w < p->iWordStart; w++ )
            pSims[w] = p->pSimsTemp[w];
        // recompute the hashing info
        uHash = 0;
        for ( w = 0; w < p->iWordStart; w++ )
            uHash ^= pSims[w] * s_FraigPrimes[w];
        p->vInputs->pArray[i]->uHashD = uHash;
    }

    // update info about the permanently stored patterns
    p->iWordPerm = p->iWordStart;
    p->iPatsPerm += nPats;
    assert( p->iWordPerm == FRAIG_NUM_WORDS( p->iPatsPerm ) );

    // resimulate and recompute the hash values
    for ( i = 1; i < p->vNodes->nSize; i++ )
        if ( Fraig_NodeIsAnd(p->vNodes->pArray[i]) )
        {
            p->vNodes->pArray[i]->uHashD = 0;
            Fraig_NodeSimulate( p->vNodes->pArray[i], 0, p->iWordPerm, 0 );
        }

    // double-check that the nodes are still distinguished
    if ( fPerformChecks )
        Fraig_FeedBackCheckTable( p );

    // rehash the values in the F0 table
    if ( p->fDoSparse ) 
    {
        Fraig_TableRehashF0( p, 0 );
        if ( fPerformChecks )
            Fraig_FeedBackCheckTableF0( p );
    }

    // check if we need to resize the simulation info
    // if less than FRAIG_WORDS_STORE words are left, reallocate simulation info
    if ( p->iWordPerm + FRAIG_WORDS_STORE > p->nWordsDyna )
        Fraig_ReallocateSimulationInfo( p );

    // set the real patterns
    Msat_IntVecClear( p->vPatsReal );
    memset( p->pSimsReal, 0, sizeof(unsigned)*p->nWordsDyna );
    for ( w = 0; w < p->iWordPerm; w++ )
        p->pSimsReal[w] = FRAIG_FULL;
    if ( p->iPatsPerm % 32 > 0 )
        p->pSimsReal[p->iWordPerm-1] = FRAIG_MASK( p->iPatsPerm % 32 );
//    printf( "The number of permanent words = %d.\n", p->iWordPerm );
    return p->iWordStart;
}